

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<DomPropertyToolTip*>::emplace<DomPropertyToolTip*&>
          (QPodArrayOps<DomPropertyToolTip_*> *this,qsizetype i,DomPropertyToolTip **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  DomPropertyToolTip **ppDVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<DomPropertyToolTip_*> *in_RDI;
  DomPropertyToolTip **where;
  GrowthPosition pos;
  DomPropertyToolTip *tmp;
  bool detach;
  QArrayDataPointer<DomPropertyToolTip_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  DomPropertyToolTip *pDVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<DomPropertyToolTip_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<DomPropertyToolTip_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppDVar3 = QArrayDataPointer<DomPropertyToolTip_*>::end(in_RDI);
      *ppDVar3 = (DomPropertyToolTip *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<DomPropertyToolTip_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8)
       , qVar2 != 0)) {
      ppDVar3 = QArrayDataPointer<DomPropertyToolTip_*>::begin
                          ((QArrayDataPointer<DomPropertyToolTip_*> *)0x1e8567);
      ppDVar3[-1] = (DomPropertyToolTip *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pDVar5 = (DomPropertyToolTip *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<DomPropertyToolTip_*>::detachAndGrow
            ((QArrayDataPointer<DomPropertyToolTip_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pDVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (DomPropertyToolTip ***)in_stack_ffffffffffffffc8,in_RDI);
  ppDVar3 = QPodArrayOps<DomPropertyToolTip_*>::createHole
                      ((QPodArrayOps<DomPropertyToolTip_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pDVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppDVar3 = pDVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }